

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::addComposites(Normalizer2Impl *this,uint16_t *list,UnicodeSet *set)

{
  _func_int **pp_Var1;
  uint16_t norm16;
  uint16_t *list_00;
  uint local_28;
  UChar32 composite;
  int32_t compositeAndFwd;
  uint16_t firstUnit;
  UnicodeSet *set_local;
  uint16_t *list_local;
  Normalizer2Impl *this_local;
  
  set_local = (UnicodeSet *)list;
  do {
    pp_Var1 = (set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject;
    if (((ulong)pp_Var1 & 1) == 0) {
      local_28 = (uint)*(ushort *)
                        ((long)&(set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                                _vptr_UObject + 2);
      set_local = (UnicodeSet *)
                  ((long)&(set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                          _vptr_UObject + 4);
    }
    else {
      local_28 = (*(ushort *)
                   ((long)&(set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                           _vptr_UObject + 2) & 0xffff003f) << 0x10 |
                 (uint)*(ushort *)
                        ((long)&(set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                                _vptr_UObject + 4);
      set_local = (UnicodeSet *)
                  ((long)&(set_local->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                          _vptr_UObject + 6);
    }
    if ((local_28 & 1) != 0) {
      norm16 = getRawNorm16(this,(int)local_28 >> 1);
      list_00 = getCompositionsListForComposite(this,norm16);
      addComposites(this,list_00,set);
    }
    UnicodeSet::add(set,(int)local_28 >> 1);
  } while (((ulong)pp_Var1 & 0x8000) == 0);
  return;
}

Assistant:

void Normalizer2Impl::addComposites(const uint16_t *list, UnicodeSet &set) const {
    uint16_t firstUnit;
    int32_t compositeAndFwd;
    do {
        firstUnit=*list;
        if((firstUnit&COMP_1_TRIPLE)==0) {
            compositeAndFwd=list[1];
            list+=2;
        } else {
            compositeAndFwd=(((int32_t)list[1]&~COMP_2_TRAIL_MASK)<<16)|list[2];
            list+=3;
        }
        UChar32 composite=compositeAndFwd>>1;
        if((compositeAndFwd&1)!=0) {
            addComposites(getCompositionsListForComposite(getRawNorm16(composite)), set);
        }
        set.add(composite);
    } while((firstUnit&COMP_1_LAST_TUPLE)==0);
}